

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O0

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *sBuffer,size_t sBufferSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  uint uVar1;
  size_t code;
  size_t local_50;
  ZSTD_DDict *ddict;
  size_t neededSpace;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  size_t sBufferSize_local;
  void *sBuffer_local;
  
  local_50 = dictSize;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_50 = 0;
  }
  if (((ulong)sBuffer & 7) == 0) {
    if (sBufferSize < local_50 + 0x6860) {
      sBuffer_local = (void *)0x0;
    }
    else {
      dictSize_local = (size_t)dict;
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy((void *)((long)sBuffer + 0x6860),dict,dictSize);
        dictSize_local = (long)sBuffer + 0x6860;
      }
      code = ZSTD_initDDict_internal
                       ((ZSTD_DDict *)sBuffer,(void *)dictSize_local,dictSize,ZSTD_dlm_byRef,
                        dictContentType);
      uVar1 = ERR_isError(code);
      sBuffer_local = sBuffer;
      if (uVar1 != 0) {
        sBuffer_local = (void *)0x0;
      }
    }
  }
  else {
    sBuffer_local = (void *)0x0;
  }
  return (ZSTD_DDict *)sBuffer_local;
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* sBuffer, size_t sBufferSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace = sizeof(ZSTD_DDict)
                             + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)sBuffer;
    assert(sBuffer != NULL);
    assert(dict != NULL);
    if ((size_t)sBuffer & 7) return NULL;   /* 8-aligned */
    if (sBufferSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}